

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  undefined1 local_e0 [8];
  LockProxy guard;
  allocator<int> local_bd;
  int local_bc [7];
  vector<int,_std::allocator<int>_> local_a0;
  undefined1 local_88 [8];
  CategoriesMutex mutex;
  
  mutex._116_4_ = 0;
  local_bc[0] = 1;
  local_bc[1] = 3;
  local_bc[2] = 5;
  local_bc._12_8_ = local_bc;
  local_bc._20_8_ = (__pthread_internal_list *)0x3;
  std::allocator<int>::allocator(&local_bd);
  __l._M_len._0_4_ = local_bc[5];
  __l._M_len._4_4_ = local_bc[6];
  __l._M_array = (iterator)local_bc._12_8_;
  std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l,&local_bd);
  CategoriesMutex::CategoriesMutex((CategoriesMutex *)local_88,&local_a0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a0);
  std::allocator<int>::~allocator(&local_bd);
  CategoriesMutex::try_lock((CategoriesMutex *)local_e0,(int)local_88);
  CategoriesMutex::LockProxy::operator_cast_to_bool((LockProxy *)local_e0);
  CategoriesMutex::LockProxy::~LockProxy((LockProxy *)local_e0);
  CategoriesMutex::~CategoriesMutex((CategoriesMutex *)local_88);
  return mutex._116_4_;
}

Assistant:

int main() {
    CategoriesMutex mutex({1, 3, 5});
    if (auto guard = mutex.try_lock(1); guard) {
        // critical section
    }
}